

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O0

int32 rw::getSizeMaterialMatFX(void *object,int32 offset,int32 param_3)

{
  int iVar1;
  long lVar2;
  uint32 uVar3;
  int local_30;
  int local_2c;
  int i;
  int32 size;
  MatFX *matfx;
  int32 param_2_local;
  int32 offset_local;
  void *object_local;
  
  lVar2 = *(long *)((long)object + (long)offset);
  if (lVar2 == 0) {
    object_local._4_4_ = -1;
  }
  else {
    local_2c = 0xc;
    for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
      iVar1 = *(int *)(lVar2 + (long)local_30 * 0x28);
      if (iVar1 == 1) {
        local_2c = local_2c + 0xc;
        if (*(long *)(lVar2 + (long)local_30 * 0x28 + 0x10) != 0) {
          uVar3 = Texture::streamGetSize(*(Texture **)(lVar2 + (long)local_30 * 0x28 + 0x10));
          local_2c = uVar3 + 0xc + local_2c;
        }
        if (*(long *)(lVar2 + (long)local_30 * 0x28 + 0x18) != 0) {
          uVar3 = Texture::streamGetSize(*(Texture **)(lVar2 + (long)local_30 * 0x28 + 0x18));
          local_2c = uVar3 + 0xc + local_2c;
        }
      }
      else if (iVar1 == 2) {
        local_2c = local_2c + 0xc;
        if (*(long *)(lVar2 + (long)local_30 * 0x28 + 0x10) != 0) {
          uVar3 = Texture::streamGetSize(*(Texture **)(lVar2 + (long)local_30 * 0x28 + 0x10));
          local_2c = uVar3 + 0xc + local_2c;
        }
      }
      else if ((iVar1 == 4) &&
              (local_2c = local_2c + 0xc, *(long *)(lVar2 + (long)local_30 * 0x28 + 8) != 0)) {
        uVar3 = Texture::streamGetSize(*(Texture **)(lVar2 + (long)local_30 * 0x28 + 8));
        local_2c = uVar3 + 0xc + local_2c;
      }
    }
    object_local._4_4_ = local_2c;
  }
  return object_local._4_4_;
}

Assistant:

static int32
getSizeMaterialMatFX(void *object, int32 offset, int32)
{
	MatFX *matfx = *PLUGINOFFSET(MatFX*, object, offset);
	if(matfx == nil)
		return -1;
	int32 size = 4 + 4 + 4;

	for(int i = 0; i < 2; i++){
		switch(matfx->fx[i].type){
		case MatFX::BUMPMAP:
			size += 4 + 4 + 4;
			if(matfx->fx[i].bump.bumpedTex)
				size += 12 +
				  matfx->fx[i].bump.bumpedTex->streamGetSize();
			if(matfx->fx[i].bump.tex)
				size += 12 +
				  matfx->fx[i].bump.tex->streamGetSize();
			break;

		case MatFX::ENVMAP:
			size += 4 + 4 + 4;
			if(matfx->fx[i].env.tex)
				size += 12 +
				  matfx->fx[i].env.tex->streamGetSize();
			break;

		case MatFX::DUAL:
			size += 4 + 4 + 4;
			if(matfx->fx[i].dual.tex)
				size += 12 +
				  matfx->fx[i].dual.tex->streamGetSize();
			break;
		}
	}
	return size;
}